

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jit_compiler_x86.cpp
# Opt level: O0

void __thiscall randomx::JitCompilerX86::h_IMULH_M(JitCompilerX86 *this,Instruction *instr,int i)

{
  int in_EDX;
  JitCompilerX86 *in_RSI;
  JitCompilerX86 *in_RDI;
  Instruction *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe8;
  
  in_RDI->registerUsage
  [*(byte *)((long)&(in_RSI->instructionOffsets).super__Vector_base<int,_std::allocator<int>_>.
                    _M_impl.super__Vector_impl_data._M_start + 1)] = in_EDX;
  if (*(char *)((long)&(in_RSI->instructionOffsets).super__Vector_base<int,_std::allocator<int>_>.
                       _M_impl.super__Vector_impl_data._M_start + 2) ==
      *(char *)((long)&(in_RSI->instructionOffsets).super__Vector_base<int,_std::allocator<int>_>.
                       _M_impl.super__Vector_impl_data._M_start + 1)) {
    emit<2ul>(in_RDI,&in_stack_ffffffffffffffd8->opcode);
    emitByte(in_RDI,*(char *)((long)&(in_RSI->instructionOffsets).
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start + 1) + 0xc0);
    emit<2ul>(in_RDI,&in_stack_ffffffffffffffd8->opcode);
    emitByte(in_RDI,0xa6);
    genAddressImm(in_RDI,in_stack_ffffffffffffffd8);
  }
  else {
    genAddressReg(in_RSI,(Instruction *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),
                  SUB81((ulong)in_RDI >> 0x38,0));
    emit<2ul>(in_RDI,&in_stack_ffffffffffffffd8->opcode);
    emitByte(in_RDI,*(char *)((long)&(in_RSI->instructionOffsets).
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start + 1) + 0xc0);
    emit<4ul>(in_RDI,&in_stack_ffffffffffffffd8->opcode);
  }
  emit<2ul>(in_RDI,&in_stack_ffffffffffffffd8->opcode);
  emitByte(in_RDI,*(char *)((long)&(in_RSI->instructionOffsets).
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start + 1) * '\b' + 0xc2);
  return;
}

Assistant:

void JitCompilerX86::h_IMULH_M(Instruction& instr, int i) {
		registerUsage[instr.dst] = i;
		if (instr.src != instr.dst) {
			genAddressReg(instr, false);
			emit(REX_MOV_RR64);
			emitByte(0xc0 + instr.dst);
			emit(REX_MUL_MEM);
		}
		else {
			emit(REX_MOV_RR64);
			emitByte(0xc0 + instr.dst);
			emit(REX_MUL_M);
			emitByte(0xa6);
			genAddressImm(instr);
		}
		emit(REX_MOV_R64R);
		emitByte(0xc2 + 8 * instr.dst);
	}